

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder__full_decode_and_uninit
                    (ma_decoder *pDecoder,ma_decoder_config *pConfigOut,ma_uint64 *pFrameCountOut,
                    void **ppPCMFramesOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var1;
  ma_uint32 mVar2;
  ma_result mVar3;
  void *pvVar4;
  ma_uint64 mVar5;
  ulong uVar6;
  ma_uint64 mVar7;
  ulong frameCount;
  void *p;
  ma_uint64 framesJustRead;
  
  uVar6 = (ulong)(*(int *)(&DAT_00176420 + (ulong)pDecoder->outputFormat * 4) *
                 pDecoder->outputChannels);
  pAllocationCallbacks = &pDecoder->allocationCallbacks;
  mVar5 = 0;
  p = (void *)0x0;
  mVar7 = 0;
  do {
    pvVar4 = p;
    if (mVar7 == mVar5) {
      p_Var1 = (pDecoder->allocationCallbacks).onRealloc;
      if (p_Var1 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
LAB_00151075:
        ma_free(p,pAllocationCallbacks);
        return MA_OUT_OF_MEMORY;
      }
      mVar5 = mVar5 * 2;
      if (mVar5 == 0) {
        mVar5 = 0x1000;
      }
      pvVar4 = (*p_Var1)(p,mVar5 * uVar6,pAllocationCallbacks->pUserData);
      if (pvVar4 == (void *)0x0) goto LAB_00151075;
    }
    p = pvVar4;
    frameCount = mVar5 - mVar7;
    mVar3 = ma_decoder_read_pcm_frames
                      (pDecoder,(void *)(mVar7 * uVar6 + (long)p),frameCount,&framesJustRead);
    mVar7 = mVar7 + framesJustRead;
    if ((mVar3 != MA_SUCCESS) || (framesJustRead < frameCount)) {
      if (pConfigOut != (ma_decoder_config *)0x0) {
        mVar2 = pDecoder->outputChannels;
        pConfigOut->format = pDecoder->outputFormat;
        pConfigOut->channels = mVar2;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
      }
      if (ppPCMFramesOut == (void **)0x0) {
        ma_free(p,pAllocationCallbacks);
      }
      else {
        *ppPCMFramesOut = p;
      }
      if (pFrameCountOut != (ma_uint64 *)0x0) {
        *pFrameCountOut = mVar7;
      }
      ma_decoder_uninit(pDecoder);
      return MA_SUCCESS;
    }
  } while( true );
}

Assistant:

static ma_result ma_decoder__full_decode_and_uninit(ma_decoder* pDecoder, ma_decoder_config* pConfigOut, ma_uint64* pFrameCountOut, void** ppPCMFramesOut)
{
    ma_result result;
    ma_uint64 totalFrameCount;
    ma_uint64 bpf;
    ma_uint64 dataCapInFrames;
    void* pPCMFramesOut;

    MA_ASSERT(pDecoder != NULL);

    totalFrameCount = 0;
    bpf = ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels);

    /* The frame count is unknown until we try reading. Thus, we just run in a loop. */
    dataCapInFrames = 0;
    pPCMFramesOut = NULL;
    for (;;) {
        ma_uint64 frameCountToTryReading;
        ma_uint64 framesJustRead;

        /* Make room if there's not enough. */
        if (totalFrameCount == dataCapInFrames) {
            void* pNewPCMFramesOut;
            ma_uint64 newDataCapInFrames = dataCapInFrames*2;
            if (newDataCapInFrames == 0) {
                newDataCapInFrames = 4096;
            }

            if ((newDataCapInFrames * bpf) > MA_SIZE_MAX) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_TOO_BIG;
            }

            pNewPCMFramesOut = (void*)ma_realloc(pPCMFramesOut, (size_t)(newDataCapInFrames * bpf), &pDecoder->allocationCallbacks);
            if (pNewPCMFramesOut == NULL) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_OUT_OF_MEMORY;
            }

            dataCapInFrames = newDataCapInFrames;
            pPCMFramesOut = pNewPCMFramesOut;
        }

        frameCountToTryReading = dataCapInFrames - totalFrameCount;
        MA_ASSERT(frameCountToTryReading > 0);

        result = ma_decoder_read_pcm_frames(pDecoder, (ma_uint8*)pPCMFramesOut + (totalFrameCount * bpf), frameCountToTryReading, &framesJustRead);
        totalFrameCount += framesJustRead;

        if (result != MA_SUCCESS) {
            break;
        }

        if (framesJustRead < frameCountToTryReading) {
            break;
        }
    }


    if (pConfigOut != NULL) {
        pConfigOut->format     = pDecoder->outputFormat;
        pConfigOut->channels   = pDecoder->outputChannels;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
    }

    if (ppPCMFramesOut != NULL) {
        *ppPCMFramesOut = pPCMFramesOut;
    } else {
        ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
    }

    if (pFrameCountOut != NULL) {
        *pFrameCountOut = totalFrameCount;
    }

    ma_decoder_uninit(pDecoder);
    return MA_SUCCESS;
}